

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-ping-udp.c
# Opt level: O2

void pinger_close_cb(uv_handle_t *handle)

{
  completed_pings = completed_pings + (long)*handle->data;
  completed_pingers = completed_pingers + 1;
  free(handle->data);
  return;
}

Assistant:

static void pinger_close_cb(uv_handle_t* handle) {
  pinger_t* pinger;

  pinger = (pinger_t*)handle->data;
#if DEBUG
  fprintf(stderr, "ping_pongs: %d roundtrips/s\n",
	  pinger->pongs / (TIME / 1000));
#endif

  completed_pings += pinger->pongs;
  completed_pingers++;
  free(pinger);
}